

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O3

void __thiscall
vkt::BindingModel::anon_unknown_1::BufferComputeInstance::writeDescriptorSet
          (BufferComputeInstance *this,VkDescriptorSet descriptorSet,VkBuffer viewA,deUint32 offsetA
          ,VkBuffer viewB,deUint32 offsetB,VkBuffer resBuf)

{
  DescriptorSetUpdateBuilder *this_00;
  ShaderInputInterface SVar1;
  undefined1 *__buf;
  int __fd;
  VkDescriptorBufferInfo bufferInfos [2];
  VkDescriptorBufferInfo resultInfo;
  
  this_00 = &this->m_updateBuilder;
  __fd = (int)descriptorSet.m_internal;
  ::vk::DescriptorSetUpdateBuilder::write(this_00,__fd,(void *)0x0,0);
  SVar1 = this->m_shaderInterface;
  if (SVar1 == SHADER_INPUT_DESCRIPTOR_ARRAY) {
LAB_0051f021:
    __buf = &DAT_00000001;
  }
  else {
    if (SVar1 != SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) {
      if (SVar1 != SHADER_INPUT_SINGLE_DESCRIPTOR) goto LAB_0051f02e;
      goto LAB_0051f021;
    }
    ::vk::DescriptorSetUpdateBuilder::write(this_00,__fd,&DAT_00000001,0);
    __buf = (undefined1 *)0x2;
  }
  ::vk::DescriptorSetUpdateBuilder::write(this_00,__fd,__buf,0);
LAB_0051f02e:
  if (this->m_updateMethod == DESCRIPTOR_UPDATE_METHOD_NORMAL) {
    ::vk::DescriptorSetUpdateBuilder::update(this_00,this->m_vki,this->m_device);
  }
  return;
}

Assistant:

void BufferComputeInstance::writeDescriptorSet (vk::VkDescriptorSet descriptorSet, vk::VkBuffer viewA, deUint32 offsetA, vk::VkBuffer viewB, deUint32 offsetB, vk::VkBuffer resBuf)
{
	const vk::VkDescriptorBufferInfo		resultInfo		= vk::makeDescriptorBufferInfo(resBuf, 0u, (vk::VkDeviceSize)ComputeInstanceResultBuffer::DATA_SIZE);
	const vk::VkDescriptorBufferInfo		bufferInfos[2]	=
	{
		vk::makeDescriptorBufferInfo(viewA, (vk::VkDeviceSize)offsetA, (vk::VkDeviceSize)sizeof(tcu::Vec4[2])),
		vk::makeDescriptorBufferInfo(viewB, (vk::VkDeviceSize)offsetB, (vk::VkDeviceSize)sizeof(tcu::Vec4[2])),
	};

	// result
	m_updateBuilder.writeSingle(descriptorSet, vk::DescriptorSetUpdateBuilder::Location::binding(0u), vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &resultInfo);

	// buffers
	switch (m_shaderInterface)
	{
		case SHADER_INPUT_SINGLE_DESCRIPTOR:
			m_updateBuilder.writeSingle(descriptorSet, vk::DescriptorSetUpdateBuilder::Location::binding(1u), m_descriptorType, &bufferInfos[0]);
			break;

		case SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS:
			m_updateBuilder.writeSingle(descriptorSet, vk::DescriptorSetUpdateBuilder::Location::binding(1u), m_descriptorType, &bufferInfos[0]);
			m_updateBuilder.writeSingle(descriptorSet, vk::DescriptorSetUpdateBuilder::Location::binding(2u), m_descriptorType, &bufferInfos[1]);
			break;

		case SHADER_INPUT_DESCRIPTOR_ARRAY:
			m_updateBuilder.writeArray(descriptorSet, vk::DescriptorSetUpdateBuilder::Location::binding(1u), m_descriptorType, 2u, bufferInfos);
			break;

		default:
			DE_FATAL("Impossible");
	}

	if (m_updateMethod == DESCRIPTOR_UPDATE_METHOD_NORMAL)
	{
		m_updateBuilder.update(m_vki, m_device);
	}
}